

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3 *db;
  Btree *p;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  Db *pDVar6;
  char zErr [128];
  char acStack_b8 [136];
  
  pcVar2 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar3 = "";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  db = context->pOut->db;
  pcVar2 = "no such database: %s";
  if (0 < (long)db->nDb) {
    uVar4 = 0;
    do {
      p = db->aDb[uVar4].pBt;
      if (p != (Btree *)0x0) {
        pDVar6 = db->aDb + uVar4;
        lVar5 = 0;
        do {
          bVar1 = pDVar6->zDbSName[lVar5];
          if (bVar1 == pcVar3[lVar5]) {
            if ((ulong)bVar1 == 0) {
              if (uVar4 < 2) {
                pcVar2 = "cannot detach database %s";
              }
              else {
                pcVar2 = "database %s is locked";
                if ((p->inTrans == '\0') && (p->nBackup == 0)) {
                  sqlite3BtreeClose(p);
                  pDVar6->pBt = (Btree *)0x0;
                  pDVar6->pSchema = (Schema *)0x0;
                  sqlite3CollapseDatabaseArray(db);
                  return;
                }
              }
              goto LAB_001bb71a;
            }
          }
          else if (""[bVar1] != ""[(byte)pcVar3[lVar5]]) break;
          lVar5 = lVar5 + 1;
        } while( true );
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (long)db->nDb);
  }
LAB_001bb71a:
  sqlite3_snprintf(0x80,acStack_b8,pcVar2);
  context->isError = 1;
  sqlite3VdbeMemSetStr(context->pOut,acStack_b8,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
  ;
  return;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}